

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::operator+[abi_cxx11_(string *__return_storage_ptr__,Catch *this,StringRef lhs,StringRef rhs)

{
  string *psVar1;
  StringRef rhs_00;
  StringRef rhs_01;
  undefined1 auStack_30 [8];
  StringRef rhs_local;
  StringRef lhs_local;
  string *ret;
  
  rhs_local.m_start = rhs.m_start;
  psVar1 = (string *)lhs.m_size;
  rhs_00.m_start = lhs.m_start;
  auStack_30 = (undefined1  [8])psVar1;
  rhs_local.m_size = (size_type)this;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  StringRef::size((StringRef *)&rhs_local.m_size);
  StringRef::size((StringRef *)auStack_30);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  rhs_00.m_size = (size_type)psVar1;
  operator+=((Catch *)__return_storage_ptr__,(string *)rhs_local.m_size,rhs_00);
  rhs_01.m_size = (size_type)psVar1;
  rhs_01.m_start = rhs_local.m_start;
  operator+=((Catch *)__return_storage_ptr__,(string *)auStack_30,rhs_01);
  return __return_storage_ptr__;
}

Assistant:

std::string operator+(StringRef lhs, StringRef rhs) {
        std::string ret;
        ret.reserve(lhs.size() + rhs.size());
        ret += lhs;
        ret += rhs;
        return ret;
    }